

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O3

ExpressionValue *
expFuncOutputName(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                 vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int iVar2;
  undefined4 extraout_var;
  string value;
  string local_78;
  StringLiteral local_58;
  string local_38;
  
  peVar1 = (g_fileManager->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this = (g_fileManager->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  if (peVar1 == (element_type *)0x0) {
    Logger::queueError<>(Error,"outputName: no file opened");
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    (__return_storage_ptr__->strValue)._value._M_string_length = 0;
    (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->field_1).intValue = 0;
  }
  else {
    iVar2 = (*peVar1->_vptr_AssemblerFile[0xf])();
    ghc::filesystem::path::u8string_abi_cxx11_(&local_38,(path *)CONCAT44(extraout_var,iVar2));
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_38._M_dataplus._M_p,
               local_38._M_dataplus._M_p + local_38._M_string_length);
    StringLiteral::StringLiteral(&local_58,&local_78);
    __return_storage_ptr__->type = String;
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->strValue,local_58._value._M_dataplus._M_p,
               local_58._value._M_dataplus._M_p + local_58._value._M_string_length);
    (__return_storage_ptr__->field_1).intValue = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._value._M_dataplus._M_p != &local_58._value.field_2) {
      operator_delete(local_58._value._M_dataplus._M_p,
                      local_58._value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncOutputName(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	std::shared_ptr<AssemblerFile> file = g_fileManager->getOpenFile();
	if (file == nullptr)
	{
		Logger::queueError(Logger::Error, "outputName: no file opened");
		return ExpressionValue();
	}

	std::string value = file->getFileName().u8string();
	return ExpressionValue(value);
}